

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypes.h
# Opt level: O2

bool __thiscall Diligent::Box::operator==(Box *this,Box *Rhs)

{
  int iVar1;
  
  iVar1 = memcmp(this,Rhs,0x18);
  return iVar1 == 0;
}

Assistant:

constexpr bool operator==(const Box &Rhs) const
    {
        return MinX == Rhs.MinX && MaxX == Rhs.MaxX &&
               MinY == Rhs.MinY && MaxY == Rhs.MaxY &&
               MinZ == Rhs.MinZ && MaxZ == Rhs.MaxZ;
    }